

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  mz_uint32 mVar1;
  mz_zip_internal_state *pmVar2;
  mz_uint64 mVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  mz_uint64 mVar8;
  ulong local_148;
  ulong local_140;
  undefined4 local_138;
  undefined1 local_134;
  undefined4 local_133;
  undefined1 uStack_12f;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  undefined1 uStack_12c;
  undefined1 uStack_12b;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  undefined4 local_128;
  undefined1 local_120;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined4 local_11c;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined4 local_114;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar2 = pZip->m_pState;
  if ((pmVar2 == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pmVar2->m_zip64 == 0) {
    if ((0xffff < pZip->m_total_files) ||
       ((pZip->m_archive_size + (pmVar2->m_central_dir).m_size) - 0xffffffea < 0xffffffff00000000))
    goto LAB_005ef2fb;
  }
  else if (0xfffffffe < (pmVar2->m_central_dir).m_size) {
LAB_005ef2fb:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (pZip->m_total_files == 0) {
    local_140 = 0;
    local_148 = 0;
  }
  else {
    local_140 = pZip->m_archive_size;
    local_148 = (pmVar2->m_central_dir).m_size;
    pZip->m_central_directory_file_ofs = local_140;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_140,(pmVar2->m_central_dir).m_p,local_148);
    if (sVar5 != local_148) {
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    pZip->m_archive_size = pZip->m_archive_size + local_148;
  }
  if (pmVar2->m_zip64 != 0) {
    mVar3 = pZip->m_archive_size;
    memset(&local_138,0,0x100);
    local_138 = 0x6064b50;
    local_134 = 0x2c;
    local_133 = 0;
    uStack_12f = 0;
    uStack_12e = 0;
    uStack_12d = 0;
    uStack_12c = 0x1e;
    uStack_12b = 3;
    uStack_12a = 0x2d;
    uStack_129 = 0;
    mVar1 = pZip->m_total_files;
    local_120 = (undefined1)mVar1;
    local_11f = (undefined1)(mVar1 >> 8);
    local_11e = (undefined1)(mVar1 >> 0x10);
    local_11d = (undefined1)(mVar1 >> 0x18);
    local_11c = 0;
    local_114 = 0;
    local_110 = (undefined1)local_148;
    local_10f = (undefined1)(local_148 >> 8);
    local_10e = (undefined1)(local_148 >> 0x10);
    local_10d = (undefined1)(local_148 >> 0x18);
    local_10c = (undefined1)(local_148 >> 0x20);
    local_10b = (undefined1)(local_148 >> 0x28);
    local_10a = (undefined1)(local_148 >> 0x30);
    local_109 = (undefined1)(local_148 >> 0x38);
    local_108 = (undefined1)local_140;
    local_107 = (undefined1)(local_140 >> 8);
    local_106 = (undefined1)(local_140 >> 0x10);
    local_105 = (undefined1)(local_140 >> 0x18);
    local_104 = (undefined1)(local_140 >> 0x20);
    local_103 = (undefined1)(local_140 >> 0x28);
    local_102 = (undefined1)(local_140 >> 0x30);
    local_101 = (undefined1)(local_140 >> 0x38);
    local_118 = local_120;
    local_117 = local_11f;
    local_116 = local_11e;
    local_115 = local_11d;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar3,&local_138,0x38);
    if (sVar5 != 0x38) goto LAB_005ef5de;
    mVar8 = pZip->m_archive_size + 0x38;
    pZip->m_archive_size = mVar8;
    memset(&local_138,0,0x100);
    local_138 = 0x7064b50;
    local_133 = CONCAT13((char)mVar3,(undefined3)local_133);
    uStack_12f = (undefined1)(mVar3 >> 8);
    uStack_12e = (undefined1)(mVar3 >> 0x10);
    uStack_12d = (undefined1)(mVar3 >> 0x18);
    uStack_12c = (undefined1)(mVar3 >> 0x20);
    uStack_12b = (undefined1)(mVar3 >> 0x28);
    uStack_12a = (undefined1)(mVar3 >> 0x30);
    uStack_129 = (undefined1)(mVar3 >> 0x38);
    local_128 = 1;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar8,&local_138,0x14);
    if (sVar5 != 0x14) goto LAB_005ef5de;
    pZip->m_archive_size = pZip->m_archive_size + 0x14;
  }
  memset(&local_138,0,0x100);
  local_138 = 0x6054b50;
  uVar7 = 0xffff;
  if (pZip->m_total_files < 0xffff) {
    uVar7 = pZip->m_total_files;
  }
  uStack_12e = (undefined1)uVar7;
  local_133 = CONCAT13(uStack_12e,(undefined3)local_133);
  uStack_12f = (undefined1)(uVar7 >> 8);
  if (0xfffffffe < local_148) {
    local_148 = 0xffffffff;
  }
  uStack_12c = (undefined1)local_148;
  uStack_12b = (undefined1)(local_148 >> 8);
  uStack_12a = (undefined1)(local_148 >> 0x10);
  uStack_129 = (undefined1)(local_148 >> 0x18);
  uVar6 = 0xffffffff;
  if (local_140 < 0xffffffff) {
    uVar6 = local_140;
  }
  local_128 = (undefined4)uVar6;
  uStack_12d = uStack_12f;
  sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,pZip->m_archive_size,&local_138,0x16);
  if (sVar5 == 0x16) {
    if (((FILE *)pmVar2->m_pFile != (FILE *)0x0) &&
       (iVar4 = fflush((FILE *)pmVar2->m_pFile), iVar4 == -1)) {
      pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
      return 0;
    }
    pZip->m_archive_size = pZip->m_archive_size + 0x16;
    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return 1;
  }
LAB_005ef5de:
  pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)
{
    mz_zip_internal_state *pState;
    mz_uint64 central_dir_ofs, central_dir_size;
    mz_uint8 hdr[256];

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if ((mz_uint64)pState->m_central_dir.m_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if ((pZip->m_total_files > MZ_UINT16_MAX) || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    central_dir_ofs = 0;
    central_dir_size = 0;
    if (pZip->m_total_files)
    {
        /* Write central directory */
        central_dir_ofs = pZip->m_archive_size;
        central_dir_size = pState->m_central_dir.m_size;
        pZip->m_central_directory_file_ofs = central_dir_ofs;
        if (pZip->m_pWrite(pZip->m_pIO_opaque, central_dir_ofs, pState->m_central_dir.m_p, (size_t)central_dir_size) != central_dir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += central_dir_size;
    }

    if (pState->m_zip64)
    {
        /* Write zip64 end of central directory header */
        mz_uint64 rel_ofs_to_zip64_ecdr = pZip->m_archive_size;

        MZ_CLEAR_ARR(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDH_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - sizeof(mz_uint32) - sizeof(mz_uint64));
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_MADE_BY_OFS, 0x031E); /* TODO: always Unix */
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_NEEDED_OFS, 0x002D);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_SIZE_OFS, central_dir_size);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_OFS_OFS, central_dir_ofs);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

        /* Write zip64 end of central directory locator */
        MZ_CLEAR_ARR(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS, rel_ofs_to_zip64_ecdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS, 1);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
    }

    /* Write end of central directory record */
    MZ_CLEAR_ARR(hdr);
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_size));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_ofs));

    if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

#ifndef MINIZ_NO_STDIO
    if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);
#endif /* #ifndef MINIZ_NO_STDIO */

    pZip->m_archive_size += MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE;

    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return MZ_TRUE;
}